

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::anon_unknown_15::IsGreaterThanZero::Eval
          (IsGreaterThanZero *this,SENode *node,bool or_equal_zero,bool *result)

{
  bool bVar1;
  Signedness SVar2;
  
  *result = false;
  SVar2 = Visit(this,node);
  bVar1 = false;
  switch(SVar2) {
  case kPositiveOrNegative:
    return false;
  case kStrictlyNegative:
    break;
  case kNegative:
    bVar1 = false;
    if (!or_equal_zero) {
      return false;
    }
    break;
  case kStrictlyPositive:
    bVar1 = true;
    break;
  case kPositive:
    bVar1 = true;
    if (!or_equal_zero) {
      return false;
    }
    break;
  default:
    goto switchD_00267e0d_caseD_0;
  }
  *result = bVar1;
switchD_00267e0d_caseD_0:
  return true;
}

Assistant:

bool Eval(const SENode* node, bool or_equal_zero, bool* result) {
    *result = false;
    switch (Visit(node)) {
      case Signedness::kPositiveOrNegative: {
        return false;
      }
      case Signedness::kStrictlyNegative: {
        *result = false;
        break;
      }
      case Signedness::kNegative: {
        if (!or_equal_zero) {
          return false;
        }
        *result = false;
        break;
      }
      case Signedness::kStrictlyPositive: {
        *result = true;
        break;
      }
      case Signedness::kPositive: {
        if (!or_equal_zero) {
          return false;
        }
        *result = true;
        break;
      }
    }
    return true;
  }